

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.cc
# Opt level: O2

bool __thiscall
sentencepiece::filesystem::PosixReadableFile::ReadAll(PosixReadableFile *this,string *line)

{
  istream *piVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  Die local_9;
  
  piVar1 = this->is_;
  if (piVar1 == (istream *)&std::cin) {
    iVar2 = logging::GetMinLogLevel();
    if (iVar2 < 3) {
      local_9.die_ = false;
      pcVar3 = logging::BaseName("third_party/sentencepiece/src/filesystem.cc");
      poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
      poVar4 = std::operator<<(poVar4,"(");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x39);
      poVar4 = std::operator<<(poVar4,") ");
      poVar4 = std::operator<<(poVar4,"LOG(");
      poVar4 = std::operator<<(poVar4,"ERROR");
      poVar4 = std::operator<<(poVar4,") ");
      std::operator<<(poVar4,"ReadAll is not supported for stdin.");
      error::Die::~Die(&local_9);
    }
  }
  else {
    __first._8_8_ = 0xffffffffffffffff;
    __first._M_sbuf = *(streambuf_type **)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0xe8);
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)line,__first,
               (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40));
  }
  return piVar1 != (istream *)&std::cin;
}

Assistant:

bool ReadAll(std::string *line) {
    if (is_ == &std::cin) {
      LOG(ERROR) << "ReadAll is not supported for stdin.";
      return false;
    }
    line->assign(std::istreambuf_iterator<char>(*is_),
                 std::istreambuf_iterator<char>());
    return true;
  }